

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
               (ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,
               ParseNodeVisitor<SymCheck> prefix,ParseNodeVisitor<SymCheck> postfix,
               ParseNode *pnodeParent)

{
  OpCode OVar1;
  code *pcVar2;
  ParseNodeVisitor<SymCheck> postfix_00;
  ParseNodeVisitor<SymCheck> postfix_01;
  bool bVar3;
  uint uVar4;
  ParseNodeVar *pPVar5;
  ParseNodeForInOrForOf *pPVar6;
  ParseNodeWhile *pPVar7;
  ParseNodeBin *pPVar8;
  ParseNodeSuperReference *pPVar9;
  ParseNodeParamPattern *pPVar10;
  ParseNodeTryFinally *pPVar11;
  ParseNodeTryCatch *pPVar12;
  ParseNodeStrTemplate *pPVar13;
  ParseNodeIf *pPVar14;
  ParseNodeUni *pPVar15;
  ParseNodeCase *pPVar16;
  ParseNodeBlock *pPVar17;
  ParseNode *pPVar18;
  ParseNodeWith *pPVar19;
  ParseNodeTri *pPVar20;
  ParseNodeFnc *pPVar21;
  undefined4 *puVar22;
  ParseNodeProg *pPVar23;
  ParseNodeTry *pPVar24;
  ParseNodeCall *pPVar25;
  ParseNodeSuperCall *pPVar26;
  ParseNodeFor *pPVar27;
  ParseNodeClass *pPVar28;
  ParseNodeSwitch *pPVar29;
  ParseNodeCatch *pPVar30;
  ParseNodeReturn *pPVar31;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *p_Var32;
  SymCheck *pSVar33;
  ByteCodeGenerator *pBVar34;
  ParseNodeVisitor<SymCheck> prefix_00;
  ParseNodeVisitor<SymCheck> prefix_01;
  ParseNodeVisitor<SymCheck> prefix_02;
  ParseNodeVisitor<SymCheck> prefix_03;
  ParseNodeVisitor<SymCheck> prefix_04;
  ParseNodeVisitor<SymCheck> prefix_05;
  ParseNodeVisitor<SymCheck> prefix_06;
  ParseNodeVisitor<SymCheck> prefix_07;
  ParseNodeVisitor<SymCheck> prefix_08;
  ParseNodeVisitor<SymCheck> prefix_09;
  ParseNodeVisitor<SymCheck> prefix_10;
  ParseNodeVisitor<SymCheck> prefix_11;
  ParseNodeVisitor<SymCheck> prefix_12;
  ParseNodeVisitor<SymCheck> prefix_13;
  ParseNodeVisitor<SymCheck> prefix_14;
  ParseNodeVisitor<SymCheck> prefix_15;
  ParseNodeVisitor<SymCheck> postfix_02;
  ParseNodeVisitor<SymCheck> postfix_03;
  ParseNodeVisitor<SymCheck> postfix_04;
  ParseNodeVisitor<SymCheck> postfix_05;
  ParseNodeVisitor<SymCheck> postfix_06;
  ParseNodeVisitor<SymCheck> postfix_07;
  ParseNodeVisitor<SymCheck> postfix_08;
  ParseNodeVisitor<SymCheck> postfix_09;
  ParseNodeVisitor<SymCheck> postfix_10;
  ParseNodeVisitor<SymCheck> postfix_11;
  ParseNodeVisitor<SymCheck> postfix_12;
  ParseNodeVisitor<SymCheck> postfix_13;
  ParseNodeVisitor<SymCheck> postfix_14;
  ParseNodeVisitor<SymCheck> postfix_15;
  ParseNodeVisitor<SymCheck> postfix_16;
  ParseNodeVisitor<SymCheck> postfix_17;
  ParseNodeVisitor<SymCheck> postfix_18;
  ParseNodeVisitor<SymCheck> postfix_19;
  ParseNodeVisitor<SymCheck> postfix_20;
  ParseNodeVisitor<SymCheck> postfix_21;
  ParseNodeVisitor<SymCheck> postfix_22;
  ParseNodeVisitor<SymCheck> postfix_23;
  ParseNodeVisitor<SymCheck> postfix_24;
  ParseNodeVisitor<SymCheck> postfix_25;
  ParseNodeVisitor<SymCheck> postfix_26;
  ParseNodeVisitor<SymCheck> postfix_27;
  ParseNodeVisitor<SymCheck> postfix_28;
  ParseNodeVisitor<SymCheck> postfix_29;
  ParseNodeVisitor<SymCheck> postfix_30;
  ParseNodeVisitor<SymCheck> postfix_31;
  ParseNodeVisitor<SymCheck> postfix_32;
  ParseNodeVisitor<SymCheck> postfix_33;
  ParseNodeVisitor<SymCheck> postfix_34;
  ParseNodeVisitor<SymCheck> postfix_35;
  ParseNodeVisitor<SymCheck> postfix_36;
  ParseNodeVisitor<SymCheck> postfix_37;
  ParseNodeVisitor<SymCheck> postfix_38;
  ParseNodeVisitor<SymCheck> postfix_39;
  ParseNodeVisitor<SymCheck> postfix_40;
  ParseNodeVisitor<SymCheck> postfix_41;
  ParseNodeVisitor<SymCheck> postfix_42;
  ParseNodeVisitor<SymCheck> postfix_43;
  ParseNodeVisitor<SymCheck> postfix_44;
  SListNodeBase<Memory::ArenaAllocator> local_70;
  uint i;
  ArenaAllocator *local_60;
  SymCheck *local_58;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_50;
  _func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *local_48;
  ByteCodeGenerator *local_40;
  SymCheck *local_38;
  
  postfix_02.m_fn = postfix.m_fn;
  local_38 = postfix.m_context;
  prefix_01.m_fn = prefix.m_fn;
  prefix_02.m_context = prefix.m_context;
  if (pnode == (ParseNode *)0x0) {
    return;
  }
  ThreadContext::ProbeCurrentStackNoDispose(0x2400,byteCodeGenerator->scriptContext);
  if (prefix_01.m_fn != (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)0x0) {
    (*prefix_01.m_fn)(pnode,byteCodeGenerator,prefix_02.m_context);
  }
  OVar1 = pnode->nop;
  local_40 = byteCodeGenerator;
  p_Var32 = prefix_01.m_fn;
  pPVar18 = pnode;
  switch(OVar1) {
  case knopCall:
    pPVar25 = ParseNode::AsParseNodeCall(pnode);
    pSVar33 = local_38;
    pBVar34 = local_40;
    postfix_25.m_fn = postfix_02.m_fn;
    postfix_25.m_context = local_38;
    local_50 = postfix_02.m_fn;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar25->pnodeTarget,local_40,prefix,postfix_25,(ParseNode *)0x0);
    pPVar25 = ParseNode::AsParseNodeCall(pnode);
    postfix_02.m_fn = local_50;
    postfix_26.m_fn = local_50;
    postfix_26.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar25->pnodeArgs,pBVar34,prefix,postfix_26,(ParseNode *)0x0);
    pPVar25 = ParseNode::AsParseNodeCall(pnode);
    if ((pPVar25->field_0x24 & 8) == 0) goto switchD_00787ffd_caseD_55;
    pPVar26 = ParseNode::AsParseNodeSuperCall(pnode);
    pSVar33 = local_38;
    byteCodeGenerator = local_40;
    postfix_27.m_fn = local_50;
    postfix_27.m_context = local_38;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              ((ParseNode *)pPVar26->pnodeThis,local_40,prefix,postfix_27,(ParseNode *)0x0);
    pPVar26 = ParseNode::AsParseNodeSuperCall(pnode);
    pPVar17 = (ParseNodeBlock *)pPVar26->pnodeNewTarget;
    postfix_02.m_fn = local_50;
    goto LAB_007888ab;
  case knopDot:
  case knopAsg:
  case knopInstOf:
  case knopIn:
  case knopEqv:
  case knopNEqv:
  case knopLogOr:
  case knopLogAnd:
  case knopCoalesce:
  case knopLsh:
  case knopRsh:
  case knopRs2:
  case knopIndex:
  case knopAsgAdd:
  case knopAsgSub:
  case knopAsgMul:
  case knopAsgDiv:
  case knopAsgExpo:
  case knopAsgMod:
  case knopAsgAnd:
  case knopAsgXor:
  case knopAsgOr:
  case knopAsgLsh:
  case knopAsgRsh:
  case knopAsgRs2:
  case knopMember:
  case knopMemberShort:
  case knopSetMember:
  case knopGetMember:
  case knopTemp:
  case knopModule:
  case knopEndCode:
  case knopDebugger:
  case knopObjectPattern:
  case knopObjectPatternMember:
switchD_00787ffd_caseD_30:
    uVar4 = ParseNode::Grfnop((uint)OVar1);
    if ((uVar4 & 4) != 0) goto switchD_00787ffd_caseD_6d;
    if ((uVar4 & 8) == 0) goto switchD_00787ffd_caseD_55;
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    pSVar33 = local_38;
    pBVar34 = local_40;
    postfix_07.m_fn = postfix_02.m_fn;
    postfix_07.m_context = local_38;
    local_48 = prefix_01.m_fn;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar8->pnode1,local_40,prefix,postfix_07,(ParseNode *)0x0);
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    p_Var32 = local_48;
    prefix_03.m_fn = local_48;
    prefix_03.m_context = prefix_02.m_context;
    postfix_08.m_fn = postfix_02.m_fn;
    postfix_08.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar8->pnode2,pBVar34,prefix_03,postfix_08,(ParseNode *)0x0);
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    bVar3 = ByteCodeGenerator::IsSuper(pPVar8->pnode1);
    if (!bVar3) goto switchD_00787ffd_caseD_55;
    pPVar9 = ParseNode::AsParseNodeSuperReference(pnode);
    pPVar17 = (ParseNodeBlock *)pPVar9->pnodeThis;
    byteCodeGenerator = local_40;
    pSVar33 = local_38;
    pPVar18 = (ParseNode *)0x0;
    break;
  case knopComma:
    local_50 = postfix_02.m_fn;
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    pSVar33 = local_38;
    pBVar34 = local_40;
    postfix_02.m_fn = local_50;
    pPVar18 = pPVar8->pnode1;
    if (pPVar18->nop == knopComma) {
      local_60 = local_40->alloc;
      i = 0;
      local_70.next = (Type)&stack0xffffffffffffff90;
      local_58 = prefix_02.m_context;
      local_48 = prefix_01.m_fn;
      do {
        pPVar8 = ParseNode::AsParseNodeBin(pPVar18);
        SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Prepend
                  ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)&stack0xffffffffffffff90
                   ,&pPVar8->pnode2);
        pPVar8 = ParseNode::AsParseNodeBin(pPVar18);
        postfix_02.m_fn = local_50;
        pPVar18 = pPVar8->pnode1;
      } while (pPVar18->nop == knopComma);
      prefix_07.m_fn = prefix_01.m_fn;
      prefix_07.m_context = local_58;
      postfix_23.m_fn = local_50;
      postfix_23.m_context = local_38;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar18,pBVar34,prefix_07,postfix_23,(ParseNode *)0x0);
      while ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)local_70.next !=
             (SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)&stack0xffffffffffffff90) {
        pPVar18 = SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::Pop
                            ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
                             &stack0xffffffffffffff90);
        prefix_08.m_fn = prefix_01.m_fn;
        prefix_08.m_context = local_58;
        postfix_24.m_fn = postfix_02.m_fn;
        postfix_24.m_context = local_38;
        Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                  (pPVar18,pBVar34,prefix_08,postfix_24,(ParseNode *)0x0);
      }
      SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::~SList
                ((SList<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)&stack0xffffffffffffff90);
      pSVar33 = local_38;
      prefix_02.m_context = local_58;
    }
    else {
      postfix_43.m_fn = local_50;
      postfix_43.m_context = local_38;
      local_48 = prefix_01.m_fn;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar18,local_40,prefix,postfix_43,(ParseNode *)0x0);
    }
    pPVar8 = ParseNode::AsParseNodeBin(pnode);
    prefix_15.m_fn = local_48;
    prefix_15.m_context = prefix_02.m_context;
    postfix_44.m_fn = postfix_02.m_fn;
    postfix_44.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar8->pnode2,pBVar34,prefix_15,postfix_44,(ParseNode *)0x0);
    goto switchD_00787ffd_caseD_55;
  case knopNew:
    pPVar25 = ParseNode::AsParseNodeCall(pnode);
    postfix_22.m_fn = postfix_02.m_fn;
    postfix_22.m_context = local_38;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar25->pnodeTarget,local_40,prefix,postfix_22,(ParseNode *)0x0);
    bVar3 = IsCallOfConstants(pnode);
    if (bVar3) goto switchD_00787ffd_caseD_55;
    pPVar25 = ParseNode::AsParseNodeCall(pnode);
    pPVar17 = (ParseNodeBlock *)pPVar25->pnodeArgs;
    goto LAB_007886b0;
  case knopQmark:
    pPVar20 = ParseNode::AsParseNodeTri(pnode);
    byteCodeGenerator = local_40;
    postfix_17.m_fn = postfix_02.m_fn;
    postfix_17.m_context = local_38;
    local_58 = prefix_02.m_context;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar20->pnode1,local_40,prefix,postfix_17,(ParseNode *)0x0);
    pPVar20 = ParseNode::AsParseNodeTri(pnode);
    pSVar33 = local_38;
    postfix_18.m_fn = postfix_02.m_fn;
    postfix_18.m_context = local_38;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar20->pnode2,byteCodeGenerator,prefix,postfix_18,(ParseNode *)0x0);
    pPVar20 = ParseNode::AsParseNodeTri(pnode);
    pPVar17 = (ParseNodeBlock *)pPVar20->pnode3;
    prefix_02.m_context = local_58;
LAB_007888ab:
    pPVar18 = (ParseNode *)0x0;
    break;
  case knopList:
    postfix_21.m_fn = postfix_02.m_fn;
    postfix_21.m_context = local_38;
    VisitList<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pnode,byteCodeGenerator,prefix,postfix_21);
    goto switchD_00787ffd_caseD_55;
  case knopVarDecl:
  case knopConstDecl:
  case knopLetDecl:
    pPVar5 = ParseNode::AsParseNodeVar(pnode);
    if (pPVar5->pnodeInit == (ParseNodePtr)0x0) goto switchD_00787ffd_caseD_55;
    pPVar5 = ParseNode::AsParseNodeVar(pnode);
    pPVar17 = (ParseNodeBlock *)pPVar5->pnodeInit;
    goto LAB_007886b0;
  case knopFncDecl:
  case knopBreak:
  case knopContinue:
    goto switchD_00787ffd_caseD_55;
  case knopClassDecl:
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    pBVar34 = local_40;
    postfix_32.m_fn = postfix_02.m_fn;
    postfix_32.m_context = local_38;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (&pPVar28->pnodeDeclName->super_ParseNode,local_40,prefix,postfix_32,(ParseNode *)0x0)
    ;
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    BeginVisitBlock(pPVar28->pnodeBlock,pBVar34);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    pSVar33 = local_38;
    postfix_33.m_fn = postfix_02.m_fn;
    postfix_33.m_context = local_38;
    local_58 = prefix_02.m_context;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar28->pnodeExtends,pBVar34,prefix,postfix_33,(ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    postfix_34.m_fn = postfix_02.m_fn;
    postfix_34.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (&pPVar28->pnodeName->super_ParseNode,local_40,prefix,postfix_34,(ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    pBVar34 = local_40;
    prefix_12.m_fn = prefix_01.m_fn;
    prefix_12.m_context = local_58;
    postfix_35.m_fn = postfix_02.m_fn;
    postfix_35.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (&pPVar28->pnodeConstructor->super_ParseNode,local_40,prefix_12,postfix_35,
               (ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    prefix_13.m_fn = prefix_01.m_fn;
    prefix_13.m_context = local_58;
    postfix_36.m_fn = postfix_02.m_fn;
    postfix_36.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar28->pnodeMembers,pBVar34,prefix_13,postfix_36,(ParseNode *)0x0);
    pPVar28 = ParseNode::AsParseNodeClass(pnode);
    pPVar17 = pPVar28->pnodeBlock;
    goto LAB_00788a8c;
  case knopProg:
    pPVar21 = ParseNode::AsParseNodeFnc(pnode);
    if (pPVar21->pnodeBody == (ParseNodePtr)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar22 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar22 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x152,"(pnode->AsParseNodeFnc()->pnodeBody)",
                         "pnode->AsParseNodeFnc()->pnodeBody");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar22 = 0;
    }
    local_70.next = (Type)((ulong)local_70.next._4_4_ << 0x20);
    pPVar21 = ParseNode::AsParseNodeFnc(pnode);
    pBVar34 = local_40;
    postfix_01.m_fn = postfix_02.m_fn;
    postfix_01.m_context = local_38;
    VisitNestedScopes<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              ((ParseNode *)pPVar21->pnodeScopes,pnode,local_40,prefix,postfix_01,
               (uint *)&stack0xffffffffffffff90,false);
    pPVar21 = ParseNode::AsParseNodeFnc(pnode);
    BeginVisitBlock(pPVar21->pnodeScopes,pBVar34);
    pPVar21 = ParseNode::AsParseNodeFnc(pnode);
    postfix_19.m_fn = postfix_02.m_fn;
    postfix_19.m_context = local_38;
    pPVar18 = VisitBlock<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                        (pPVar21->pnodeBody,pBVar34,prefix,postfix_19,(ParseNode *)0x0);
    pPVar23 = ParseNode::AsParseNodeProg(pnode);
    pPVar23->pnodeLastValStmt = pPVar18;
    pPVar21 = ParseNode::AsParseNodeFnc(pnode);
    pPVar17 = pPVar21->pnodeScopes;
    goto LAB_00788a8c;
  case knopFor:
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    pBVar34 = local_40;
    BeginVisitBlock(pPVar27->pnodeBlock,local_40);
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    pSVar33 = local_38;
    postfix_28.m_fn = postfix_02.m_fn;
    postfix_28.m_context = local_38;
    local_50 = postfix_02.m_fn;
    local_48 = prefix_01.m_fn;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar27->pnodeInit,pBVar34,prefix,postfix_28,(ParseNode *)0x0);
    ByteCodeGenerator::EnterLoop(pBVar34);
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    postfix_02.m_fn = local_48;
    prefix_09.m_fn = local_48;
    prefix_09.m_context = prefix_02.m_context;
    postfix_29.m_fn = local_50;
    postfix_29.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar27->pnodeCond,pBVar34,prefix_09,postfix_29,(ParseNode *)0x0);
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    prefix_10.m_fn = postfix_02.m_fn;
    prefix_10.m_context = prefix_02.m_context;
    postfix_30.m_fn = local_50;
    postfix_30.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar27->pnodeIncr,pBVar34,prefix_10,postfix_30,(ParseNode *)0x0);
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    postfix_02.m_fn = local_50;
    prefix_11.m_fn = local_48;
    prefix_11.m_context = prefix_02.m_context;
    postfix_31.m_fn = local_50;
    postfix_31.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar27->pnodeBody,pBVar34,prefix_11,postfix_31,pnode);
    pBVar34->loopDepth = pBVar34->loopDepth - 1;
    pPVar27 = ParseNode::AsParseNodeFor(pnode);
    pPVar17 = pPVar27->pnodeBlock;
    goto LAB_00788a8c;
  case knopIf:
    pPVar14 = ParseNode::AsParseNodeIf(pnode);
    pSVar33 = local_38;
    pBVar34 = local_40;
    postfix_11.m_fn = postfix_02.m_fn;
    postfix_11.m_context = local_38;
    local_48 = prefix_01.m_fn;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar14->pnodeCond,local_40,prefix,postfix_11,(ParseNode *)0x0);
    pPVar14 = ParseNode::AsParseNodeIf(pnode);
    p_Var32 = local_48;
    prefix_04.m_fn = local_48;
    prefix_04.m_context = prefix_02.m_context;
    postfix_12.m_fn = postfix_02.m_fn;
    postfix_12.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar14->pnodeTrue,pBVar34,prefix_04,postfix_12,pnode);
    pPVar14 = ParseNode::AsParseNodeIf(pnode);
    if (pPVar14->pnodeFalse == (ParseNodePtr)0x0) goto switchD_00787ffd_caseD_55;
    pPVar14 = ParseNode::AsParseNodeIf(pnode);
    pPVar17 = (ParseNodeBlock *)pPVar14->pnodeFalse;
    byteCodeGenerator = local_40;
    pSVar33 = local_38;
    break;
  case knopWhile:
  case knopDoWhile:
    ByteCodeGenerator::EnterLoop(byteCodeGenerator);
    pPVar7 = ParseNode::AsParseNodeWhile(pnode);
    pSVar33 = local_38;
    postfix_05.m_fn = postfix_02.m_fn;
    postfix_05.m_context = local_38;
    local_48 = prefix_01.m_fn;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar7->pnodeCond,byteCodeGenerator,prefix,postfix_05,(ParseNode *)0x0);
    pPVar7 = ParseNode::AsParseNodeWhile(pnode);
    prefix_02.m_fn = local_48;
    postfix_06.m_fn = postfix_02.m_fn;
    postfix_06.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar7->pnodeBody,byteCodeGenerator,prefix_02,postfix_06,pnode);
    byteCodeGenerator->loopDepth = byteCodeGenerator->loopDepth - 1;
    goto switchD_00787ffd_caseD_55;
  case knopForIn:
  case knopForOf:
  case knopForAwaitOf:
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    pBVar34 = local_40;
    BeginVisitBlock(pPVar6->pnodeBlock,local_40);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    postfix_02.m_context = local_38;
    local_58 = prefix_02.m_context;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar6->pnodeLval,pBVar34,prefix,postfix_02,(ParseNode *)0x0);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    prefix_02.m_context = local_38;
    postfix_03.m_fn = postfix_02.m_fn;
    postfix_03.m_context = local_38;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar6->pnodeObj,pBVar34,prefix,postfix_03,(ParseNode *)0x0);
    ByteCodeGenerator::EnterLoop(pBVar34);
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    prefix_01.m_context = local_58;
    postfix_04.m_fn = postfix_02.m_fn;
    postfix_04.m_context = prefix_02.m_context;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar6->pnodeBody,pBVar34,prefix_01,postfix_04,pnode);
    pBVar34->loopDepth = pBVar34->loopDepth - 1;
    pPVar6 = ParseNode::AsParseNodeForInOrForOf(pnode);
    pPVar17 = pPVar6->pnodeBlock;
    goto LAB_00788a8c;
  case knopBlock:
    local_48 = prefix_01.m_fn;
    pPVar17 = ParseNode::AsParseNodeBlock(pnode);
    pBVar34 = local_40;
    if (pPVar17->pnodeStmt == (ParseNodePtr)0x0) {
      pPVar17->pnodeLastValStmt = (ParseNodePtr)0x0;
      goto switchD_00787ffd_caseD_55;
    }
    BeginVisitBlock(pPVar17,local_40);
    prefix_05.m_fn = local_48;
    prefix_05.m_context = prefix_02.m_context;
    postfix_15.m_fn = postfix_02.m_fn;
    postfix_15.m_context = local_38;
    pPVar18 = VisitBlock<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                        (pPVar17->pnodeStmt,pBVar34,prefix_05,postfix_15,pnode);
    pPVar17->pnodeLastValStmt = pPVar18;
    goto LAB_00788a8c;
  case knopStrTemplate:
    pPVar13 = ParseNode::AsParseNodeStrTemplate(pnode);
    byteCodeGenerator = local_40;
    if ((pPVar13->field_0x2a & 1) == 0) {
      pPVar13 = ParseNode::AsParseNodeStrTemplate(pnode);
      postfix_10.m_fn = postfix_02.m_fn;
      postfix_10.m_context = local_38;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar13->pnodeStringLiterals,byteCodeGenerator,prefix,postfix_10,(ParseNode *)0x0);
    }
    pPVar13 = ParseNode::AsParseNodeStrTemplate(pnode);
    pPVar17 = (ParseNodeBlock *)pPVar13->pnodeSubstitutionExpressions;
    goto LAB_00788378;
  case knopWith:
    pPVar19 = ParseNode::AsParseNodeWith(pnode);
    pSVar33 = local_38;
    pBVar34 = local_40;
    postfix_16.m_fn = postfix_02.m_fn;
    postfix_16.m_context = local_38;
    local_48 = prefix_01.m_fn;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar19->pnodeObj,local_40,prefix,postfix_16,(ParseNode *)0x0);
    pPVar19 = ParseNode::AsParseNodeWith(pnode);
    postfix_00.m_fn = postfix_02.m_fn;
    postfix_00.m_context = pSVar33;
    prefix_00.m_fn = local_48;
    prefix_00.m_context = prefix_02.m_context;
    VisitWithStmt<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pnode,pPVar19->pnodeObj->location,pBVar34,prefix_00,postfix_00,pnode);
    goto switchD_00787ffd_caseD_55;
  case knopSwitch:
    pPVar29 = ParseNode::AsParseNodeSwitch(pnode);
    postfix_37.m_fn = postfix_02.m_fn;
    postfix_37.m_context = local_38;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar29->pnodeVal,local_40,prefix,postfix_37,(ParseNode *)0x0);
    pPVar29 = ParseNode::AsParseNodeSwitch(pnode);
    BeginVisitBlock(pPVar29->pnodeBlock,local_40);
    pPVar29 = ParseNode::AsParseNodeSwitch(pnode);
    for (pPVar18 = (ParseNode *)&pPVar29->pnodeCases; pPVar18 = *(ParseNode **)pPVar18,
        pPVar18 != (ParseNode *)0x0; pPVar18 = pPVar18 + 2) {
      postfix_38.m_fn = postfix_02.m_fn;
      postfix_38.m_context = local_38;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar18,local_40,prefix,postfix_38,pnode);
    }
    pPVar29 = ParseNode::AsParseNodeSwitch(pnode);
    pBVar34 = local_40;
    postfix_39.m_fn = postfix_02.m_fn;
    postfix_39.m_context = local_38;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              ((ParseNode *)pPVar29->pnodeBlock,local_40,prefix,postfix_39,(ParseNode *)0x0);
    pPVar29 = ParseNode::AsParseNodeSwitch(pnode);
    pPVar17 = pPVar29->pnodeBlock;
LAB_00788a8c:
    EndVisitBlock(pPVar17,pBVar34);
    goto switchD_00787ffd_caseD_55;
  case knopCase:
    pPVar16 = ParseNode::AsParseNodeCase(pnode);
    pSVar33 = local_38;
    byteCodeGenerator = local_40;
    postfix_13.m_fn = postfix_02.m_fn;
    postfix_13.m_context = local_38;
    local_48 = prefix_01.m_fn;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar16->pnodeExpr,local_40,prefix,postfix_13,(ParseNode *)0x0);
    pPVar16 = ParseNode::AsParseNodeCase(pnode);
    pPVar17 = pPVar16->pnodeBody;
    p_Var32 = local_48;
    break;
  case knopTryCatch:
    pPVar12 = ParseNode::AsParseNodeTryCatch(pnode);
    pSVar33 = local_38;
    byteCodeGenerator = local_40;
    postfix_14.m_fn = postfix_02.m_fn;
    postfix_14.m_context = local_38;
    local_48 = prefix_01.m_fn;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              ((ParseNode *)pPVar12->pnodeTry,local_40,prefix,postfix_14,pnode);
    pPVar12 = ParseNode::AsParseNodeTryCatch(pnode);
    goto LAB_00788408;
  case knopCatch:
    BeginVisitCatch(pnode,byteCodeGenerator);
    pPVar30 = ParseNode::AsParseNodeCatch(pnode);
    pSVar33 = local_38;
    postfix_40.m_fn = postfix_02.m_fn;
    postfix_40.m_context = local_38;
    local_48 = prefix_01.m_fn;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar30->pnodeParam,byteCodeGenerator,prefix,postfix_40,(ParseNode *)0x0);
    pPVar30 = ParseNode::AsParseNodeCatch(pnode);
    prefix_14.m_fn = local_48;
    prefix_14.m_context = prefix_02.m_context;
    postfix_41.m_fn = postfix_02.m_fn;
    postfix_41.m_context = pSVar33;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              (pPVar30->pnodeBody,byteCodeGenerator,prefix_14,postfix_41,pnode);
    EndVisitCatch(pnode,byteCodeGenerator);
    goto switchD_00787ffd_caseD_55;
  case knopReturn:
    pPVar31 = ParseNode::AsParseNodeReturn(pnode);
    if (pPVar31->pnodeExpr == (ParseNodePtr)0x0) goto switchD_00787ffd_caseD_55;
    pPVar31 = ParseNode::AsParseNodeReturn(pnode);
    pPVar17 = (ParseNodeBlock *)pPVar31->pnodeExpr;
    goto LAB_007886b0;
  case knopTry:
    pPVar24 = ParseNode::AsParseNodeTry(pnode);
    goto LAB_0078869a;
  case knopThrow:
    goto switchD_00787ffd_caseD_6d;
  case knopFinally:
    pPVar24 = (ParseNodeTry *)ParseNode::AsParseNodeFinally(pnode);
LAB_0078869a:
    pPVar17 = (ParseNodeBlock *)pPVar24->pnodeBody;
    byteCodeGenerator = local_40;
    pSVar33 = local_38;
    break;
  case knopTryFinally:
    pPVar11 = ParseNode::AsParseNodeTryFinally(pnode);
    pSVar33 = local_38;
    byteCodeGenerator = local_40;
    postfix_09.m_fn = postfix_02.m_fn;
    postfix_09.m_context = local_38;
    local_48 = prefix_01.m_fn;
    Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
              ((ParseNode *)pPVar11->pnodeTry,local_40,prefix,postfix_09,pnode);
    pPVar12 = (ParseNodeTryCatch *)ParseNode::AsParseNodeTryFinally(pnode);
LAB_00788408:
    pPVar17 = (ParseNodeBlock *)pPVar12->pnodeCatch;
    p_Var32 = local_48;
    break;
  case knopArrayPattern:
    if (byteCodeGenerator->inDestructuredPattern == false) {
      byteCodeGenerator->inDestructuredPattern = true;
      pPVar15 = ParseNode::AsParseNodeUni(pnode);
      postfix_42.m_fn = postfix_02.m_fn;
      postfix_42.m_context = local_38;
      Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
                (pPVar15->pnode1,byteCodeGenerator,prefix,postfix_42,(ParseNode *)0x0);
      byteCodeGenerator->inDestructuredPattern = false;
      goto switchD_00787ffd_caseD_55;
    }
LAB_0078836c:
    pPVar15 = ParseNode::AsParseNodeUni(pnode);
    pPVar17 = (ParseNodeBlock *)pPVar15->pnode1;
LAB_00788378:
    pSVar33 = local_38;
    pPVar18 = (ParseNode *)0x0;
    break;
  case knopParamPattern:
    pPVar10 = ParseNode::AsParseNodeParamPattern(pnode);
    goto LAB_007886ac;
  case knopExportDefault:
    pPVar10 = (ParseNodeParamPattern *)ParseNode::AsParseNodeExportDefault(pnode);
    goto LAB_007886ac;
  default:
    if (OVar1 == knopTypeof) goto LAB_0078836c;
    if (OVar1 != knopArray) goto switchD_00787ffd_caseD_30;
    bVar3 = EmitAsConstantArray(pnode,byteCodeGenerator);
    if (bVar3) goto switchD_00787ffd_caseD_55;
    goto switchD_00787ffd_caseD_6d;
  }
LAB_007886c6:
  prefix_06.m_fn = p_Var32;
  prefix_06.m_context = prefix_02.m_context;
  postfix_20.m_fn = postfix_02.m_fn;
  postfix_20.m_context = pSVar33;
  Visit<ParseNodeVisitor<SymCheck>,ParseNodeVisitor<SymCheck>>
            ((ParseNode *)pPVar17,byteCodeGenerator,prefix_06,postfix_20,pPVar18);
switchD_00787ffd_caseD_55:
  if (pnodeParent != (ParseNode *)0x0) {
    PropagateFlags(pnode,pnodeParent);
  }
  if (postfix_02.m_fn != (_func_void_ParseNode_ptr_ByteCodeGenerator_ptr_SymCheck_ptr *)0x0) {
    (*postfix_02.m_fn)(pnode,local_40,local_38);
  }
  return;
switchD_00787ffd_caseD_6d:
  pPVar10 = (ParseNodeParamPattern *)ParseNode::AsParseNodeUni(pnode);
LAB_007886ac:
  pPVar17 = (ParseNodeBlock *)(pPVar10->super_ParseNodeUni).pnode1;
LAB_007886b0:
  byteCodeGenerator = local_40;
  pSVar33 = local_38;
  pPVar18 = (ParseNode *)0x0;
  goto LAB_007886c6;
}

Assistant:

void Visit(ParseNode *pnode, ByteCodeGenerator* byteCodeGenerator, PrefixFn prefix, PostfixFn postfix, ParseNode *pnodeParent)
{
    if (pnode == nullptr)
    {
        return;
    }

    ThreadContext::ProbeCurrentStackNoDispose(Js::Constants::MinStackByteCodeVisitor, byteCodeGenerator->GetScriptContext());

    prefix(pnode, byteCodeGenerator);
    switch (pnode->nop)
    {
    default:
    {
        uint flags = ParseNode::Grfnop(pnode->nop);
        if (flags&fnopUni)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        else if (flags&fnopBin)
        {
            Visit(pnode->AsParseNodeBin()->pnode1, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);

            if (ByteCodeGenerator::IsSuper(pnode->AsParseNodeBin()->pnode1))
            {
                Visit(pnode->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, prefix, postfix);
            }
        }

        break;
    }

    case knopParamPattern:
        Visit(pnode->AsParseNodeParamPattern()->pnode1, byteCodeGenerator, prefix, postfix);
        break;

    case knopArrayPattern:
        if (!byteCodeGenerator->InDestructuredPattern())
        {
            byteCodeGenerator->SetInDestructuredPattern(true);
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
            byteCodeGenerator->SetInDestructuredPattern(false);
        }
        else
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopCall:
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);

        if (pnode->AsParseNodeCall()->isSuperCall)
        {
            Visit(pnode->AsParseNodeSuperCall()->pnodeThis, byteCodeGenerator, prefix, postfix);
            Visit(pnode->AsParseNodeSuperCall()->pnodeNewTarget, byteCodeGenerator, prefix, postfix);
        }
        break;

    case knopNew:
    {
        Visit(pnode->AsParseNodeCall()->pnodeTarget, byteCodeGenerator, prefix, postfix);
        if (!IsCallOfConstants(pnode))
        {
            Visit(pnode->AsParseNodeCall()->pnodeArgs, byteCodeGenerator, prefix, postfix);
        }
        break;
    }

    case knopQmark:
        Visit(pnode->AsParseNodeTri()->pnode1, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode2, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeTri()->pnode3, byteCodeGenerator, prefix, postfix);
        break;
    case knopList:
        VisitList(pnode, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopVarDecl    , "varDcl"    ,None    ,Var  ,fnopNone)
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
        if (pnode->AsParseNodeVar()->pnodeInit != nullptr)
            Visit(pnode->AsParseNodeVar()->pnodeInit, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopFncDecl    , "fncDcl"    ,None    ,Fnc  ,fnopLeaf)
    case knopFncDecl:
    {
        // Inner function declarations are visited before anything else in the scope.
        // (See VisitFunctionsInScope.)
        break;
    }
    case knopClassDecl:
    {
        Visit(pnode->AsParseNodeClass()->pnodeDeclName, byteCodeGenerator, prefix, postfix);
        // Now visit the class name and methods.
        BeginVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        // The extends clause is bound to the scope which contains the class name
        // (and the class name identifier is in a TDZ when the extends clause is evaluated).
        // See ES 2017 14.5.13 Runtime Semantics: ClassDefinitionEvaluation.
        Visit(pnode->AsParseNodeClass()->pnodeExtends, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeName, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeConstructor, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeClass()->pnodeMembers, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeClass()->pnodeBlock, byteCodeGenerator);
        break;
    }
    case knopStrTemplate:
    {
        // Visit the string node lists only if we do not have a tagged template.
        // We never need to visit the raw strings as they are not used in non-tagged templates and
        // tagged templates will register them as part of the callsite constant object.
        if (!pnode->AsParseNodeStrTemplate()->isTaggedTemplate)
        {
            Visit(pnode->AsParseNodeStrTemplate()->pnodeStringLiterals, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeStrTemplate()->pnodeSubstitutionExpressions, byteCodeGenerator, prefix, postfix);
        break;
    }
    case knopExportDefault:
        Visit(pnode->AsParseNodeExportDefault()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopProg       , "program"    ,None    ,Fnc  ,fnopNone)
    case knopProg:
    {
        // We expect that the global statements have been generated (meaning that the pnodeFncs
        // field is a real pointer, not an enumeration).
        Assert(pnode->AsParseNodeFnc()->pnodeBody);

        uint i = 0;
        VisitNestedScopes(pnode->AsParseNodeFnc()->pnodeScopes, pnode, byteCodeGenerator, prefix, postfix, &i);
        // Visiting global code: track the last value statement.
        BeginVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);
        pnode->AsParseNodeProg()->pnodeLastValStmt = VisitBlock(pnode->AsParseNodeFnc()->pnodeBody, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeFnc()->pnodeScopes, byteCodeGenerator);

        break;
    }
    case knopFor:
        BeginVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeFor()->pnodeInit, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeFor()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeIncr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeFor()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeFor()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopIf         , "if"        ,None    ,If   ,fnopNone)
    case knopIf:
        Visit(pnode->AsParseNodeIf()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeIf()->pnodeTrue, byteCodeGenerator, prefix, postfix, pnode);
        if (pnode->AsParseNodeIf()->pnodeFalse != nullptr)
        {
            Visit(pnode->AsParseNodeIf()->pnodeFalse, byteCodeGenerator, prefix, postfix, pnode);
        }
        break;
    // PTNODE(knopWhile      , "while"        ,None    ,While,fnopBreak|fnopContinue)
    // PTNODE(knopDoWhile    , "do-while"    ,None    ,While,fnopBreak|fnopContinue)
    case knopDoWhile:
    case knopWhile:
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeWhile()->pnodeCond, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeWhile()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        break;
    // PTNODE(knopForIn      , "for in"    ,None    ,ForIn,fnopBreak|fnopContinue|fnopCleanup)
    case knopForIn:
    case knopForOf:
    case knopForAwaitOf:
        BeginVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeLval, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeObj, byteCodeGenerator, prefix, postfix);
        byteCodeGenerator->EnterLoop();
        Visit(pnode->AsParseNodeForInOrForOf()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        byteCodeGenerator->ExitLoop();
        EndVisitBlock(pnode->AsParseNodeForInOrForOf()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopReturn     , "return"    ,None    ,Uni  ,fnopNone)
    case knopReturn:
        if (pnode->AsParseNodeReturn()->pnodeExpr != nullptr)
            Visit(pnode->AsParseNodeReturn()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopBlock      , "{}"        ,None    ,Block,fnopNone)
    case knopBlock:
    {
        ParseNodeBlock * pnodeBlock = pnode->AsParseNodeBlock();
        if (pnodeBlock->pnodeStmt != nullptr)
        {
            BeginVisitBlock(pnodeBlock, byteCodeGenerator);
            pnodeBlock->pnodeLastValStmt = VisitBlock(pnodeBlock->pnodeStmt, byteCodeGenerator, prefix, postfix, pnode);
            EndVisitBlock(pnodeBlock, byteCodeGenerator);
        }
        else
        {
            pnodeBlock->pnodeLastValStmt = nullptr;
        }
        break;
    }
    // PTNODE(knopWith       , "with"        ,None    ,With ,fnopCleanup)
    case knopWith:
        Visit(pnode->AsParseNodeWith()->pnodeObj, byteCodeGenerator, prefix, postfix);
        VisitWithStmt(pnode, pnode->AsParseNodeWith()->pnodeObj->location, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopBreak      , "break"        ,None    ,Jump ,fnopNone)
    case knopBreak:
        // TODO: some representation of target
        break;
    // PTNODE(knopContinue   , "continue"    ,None    ,Jump ,fnopNone)
    case knopContinue:
        // TODO: some representation of target
        break;
    // PTNODE(knopSwitch     , "switch"    ,None    ,Switch,fnopBreak)
    case knopSwitch:
        Visit(pnode->AsParseNodeSwitch()->pnodeVal, byteCodeGenerator, prefix, postfix);
        BeginVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        for (ParseNodeCase *pnodeT = pnode->AsParseNodeSwitch()->pnodeCases; nullptr != pnodeT; pnodeT = pnodeT->pnodeNext)
        {
            Visit(pnodeT, byteCodeGenerator, prefix, postfix, pnode);
        }
        Visit(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator, prefix, postfix);
        EndVisitBlock(pnode->AsParseNodeSwitch()->pnodeBlock, byteCodeGenerator);
        break;
    // PTNODE(knopCase       , "case"        ,None    ,Case ,fnopNone)
    case knopCase:
        Visit(pnode->AsParseNodeCase()->pnodeExpr, byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCase()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopTypeof:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    // PTNODE(knopTryCatchFinally,"try-catch-finally",None,TryCatchFinally,fnopCleanup)
    case knopTryFinally:
        Visit(pnode->AsParseNodeTryFinally()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryFinally()->pnodeFinally, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTryCatch      , "try-catch" ,None    ,TryCatch  ,fnopCleanup)
    case knopTryCatch:
        Visit(pnode->AsParseNodeTryCatch()->pnodeTry, byteCodeGenerator, prefix, postfix, pnode);
        Visit(pnode->AsParseNodeTryCatch()->pnodeCatch, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopTry        , "try"       ,None    ,Try  ,fnopCleanup)
    case knopTry:
        Visit(pnode->AsParseNodeTry()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    case knopCatch:
        BeginVisitCatch(pnode, byteCodeGenerator);
        Visit(pnode->AsParseNodeCatch()->GetParam(), byteCodeGenerator, prefix, postfix);
        Visit(pnode->AsParseNodeCatch()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        EndVisitCatch(pnode, byteCodeGenerator);
        break;
    case knopFinally:
        Visit(pnode->AsParseNodeFinally()->pnodeBody, byteCodeGenerator, prefix, postfix, pnode);
        break;
    // PTNODE(knopThrow      , "throw"     ,None    ,Uni  ,fnopNone)
    case knopThrow:
        Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        break;
    case knopArray:
    {
        bool arrayLitOpt = EmitAsConstantArray(pnode, byteCodeGenerator);
        if (!arrayLitOpt)
        {
            Visit(pnode->AsParseNodeUni()->pnode1, byteCodeGenerator, prefix, postfix);
        }
        break;
    }
    case knopComma:
    {
        ParseNode *pnode1 = pnode->AsParseNodeBin()->pnode1;
        if (pnode1->nop == knopComma)
        {
            // Spot-fix to avoid recursion on very large comma expressions.
            ArenaAllocator *alloc = byteCodeGenerator->GetAllocator();
            SList<ParseNode*> rhsStack(alloc);
            do
            {
                rhsStack.Push(pnode1->AsParseNodeBin()->pnode2);
                pnode1 = pnode1->AsParseNodeBin()->pnode1;
            }
            while (pnode1->nop == knopComma);

            Visit(pnode1, byteCodeGenerator, prefix, postfix);
            while (!rhsStack.Empty())
            {
                ParseNode *pnodeRhs = rhsStack.Pop();
                Visit(pnodeRhs, byteCodeGenerator, prefix, postfix);
            }
        }
        else
        {
            Visit(pnode1, byteCodeGenerator, prefix, postfix);
        }
        Visit(pnode->AsParseNodeBin()->pnode2, byteCodeGenerator, prefix, postfix);
    }
        break;
    }
    if (pnodeParent)
    {
        PropagateFlags(pnode, pnodeParent);
    }
    postfix(pnode, byteCodeGenerator);
}